

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O2

uint8_t * google::protobuf::internal::
          MapEntryFuncs<int,_google::protobuf::FloatValue,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
          ::InternalSerialize(int field_number,int *key,FloatValue *value,uint8_t *ptr,
                             EpsCopyOutputStream *stream)

{
  uint32_t value_00;
  uint8_t *puVar1;
  
  puVar1 = io::EpsCopyOutputStream::EnsureSpace(stream,ptr);
  puVar1 = WireFormatLite::WriteTagToArray(field_number,WIRETYPE_LENGTH_DELIMITED,puVar1);
  value_00 = GetCachedSize(key,value);
  puVar1 = io::CodedOutputStream::WriteVarint32ToArray(value_00,puVar1);
  puVar1 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)5,_int>::Write
                     (1,key,puVar1,stream);
  puVar1 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_google::protobuf::FloatValue>
           ::Write(2,value,puVar1,stream);
  return puVar1;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }